

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O3

char * cmime_header_to_string(CMimeHeader_T *header)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *__fmt;
  int pos;
  char *local_38;
  char *ptemp;
  
  local_38 = (char *)0x0;
  if (header == (CMimeHeader_T *)0x0) {
    __assert_fail("header",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                  ,0x68,"char *cmime_header_to_string(CMimeHeader_T *)");
  }
  __s = (char *)calloc(1,1);
  if (0 < (int)header->count) {
    pos = 0;
    do {
      pcVar1 = cmime_header_get_value(header,pos);
      if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
        asprintf(&local_38,"%s:",header->name);
      }
      else {
        if (header->parsed == 1) {
          pcVar4 = header->name;
LAB_00109391:
          __fmt = "%s:%s";
        }
        else {
          pcVar4 = header->name;
          if (*pcVar1 == ' ') goto LAB_00109391;
          __fmt = "%s: %s";
        }
        asprintf(&local_38,__fmt,pcVar4,pcVar1);
      }
      sVar2 = strlen(__s);
      pcVar1 = local_38;
      sVar3 = strlen(local_38);
      __s = (char *)realloc(__s,sVar2 + sVar3 + 1);
      strcat(__s,pcVar1);
      free(pcVar1);
      pos = pos + 1;
    } while (pos < (int)header->count);
  }
  return __s;
}

Assistant:

char *cmime_header_to_string(CMimeHeader_T *header) {
    char *out = NULL;
    char *value = NULL;
    int i = 0;
    char *ptemp = NULL;
    
    assert(header);

    out = (char *)calloc(sizeof(char),sizeof(char));
    for(i = 0; i < cmime_header_get_count(header); i++) {
        value = cmime_header_get_value(header,i);
        if ((value !=NULL) && (strlen(value)>0)) {
            if (header->parsed==1) {
                asprintf(&ptemp,"%s:%s",cmime_header_get_name(header),value);
            } else {
                if (value[0] == (unsigned char)32)
                    asprintf(&ptemp,"%s:%s",cmime_header_get_name(header),value);
                else
                    asprintf(&ptemp,"%s: %s",cmime_header_get_name(header),value);
            }
        } else {
            asprintf(&ptemp,"%s:",cmime_header_get_name(header));
        }
        out = (char *)realloc(out,strlen(out) + strlen(ptemp) + 1);
        strcat(out,ptemp);
        free(ptemp);
    }
    
    return(out);
}